

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
::count<std::__cxx11::string>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  const_iterator cVar1;
  
  cVar1 = find<std::__cxx11::string>(this,key);
  return (ulong)(cVar1.inner_.ctrl_ != (ctrl_t *)(*(long *)this + *(long *)(this + 0x18)));
}

Assistant:

size_t count(const key_arg<K>& key) const
			{
				return find(key) == end() ? size_t(0) : size_t(1);
			}